

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O1

double lognchoosek(int nn,int k)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 local_18;
  
  if (0 < k) {
    iVar1 = -k;
    dVar4 = 0.0;
    local_18 = 1.0;
    do {
      dVar2 = log((double)(nn + 1 + iVar1));
      dVar3 = log(local_18);
      dVar4 = (dVar2 + dVar4) - dVar3;
      local_18 = local_18 + 1.0;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double lognchoosek(int nn, int k)
{
    double s=0;
    for (int i=1; i<=k; i++) s = s + log(nn-k+i)-log(i);
    return s;
}